

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall Js::ParseableFunctionInfo::CleanupToReparse(ParseableFunctionInfo *this)

{
  bool bVar1;
  FunctionBody *pFVar2;
  ParseableFunctionInfo *this_local;
  
  bVar1 = FunctionProxy::IsFunctionBody(&this->super_FunctionProxy);
  if (bVar1) {
    pFVar2 = FunctionProxy::GetFunctionBody(&this->super_FunctionProxy);
    FunctionBody::UnlockCounters(pFVar2);
  }
  ForEachNestedFunc<Js::ParseableFunctionInfo::CleanupToReparse()::__0>(this);
  CleanupToReparseHelper(this);
  bVar1 = FunctionProxy::IsFunctionBody(&this->super_FunctionProxy);
  if (bVar1) {
    pFVar2 = FunctionProxy::GetFunctionBody(&this->super_FunctionProxy);
    FunctionBody::CleanupToReparseHelper(pFVar2);
  }
  return;
}

Assistant:

void ParseableFunctionInfo::CleanupToReparse()
    {
#if DBG
        if (this->IsFunctionBody())
        {
            GetFunctionBody()->UnlockCounters();
        }
#endif
        // The current function is already compiled. In order to prep this function to ready for debug mode, most of the previous information need to be thrown away.
        // Clean up the nested functions
        this->ForEachNestedFunc([&](FunctionProxy* proxy, uint32 index)
        {
            // Note: redeferred functions may have fully compiled children. If we find a redeferred function, keep walking.
            if (proxy && ((proxy->CanBeDeferred() && proxy->GetFunctionInfo()->GetCompileCount() > 0) || proxy->IsFunctionBody()))
            {
                proxy->GetParseableFunctionInfo()->CleanupToReparse();
            }
            return true;
        });

        this->CleanupToReparseHelper();
        if (this->IsFunctionBody())
        {
            this->GetFunctionBody()->CleanupToReparseHelper();
        }
    }